

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O1

void TMS320C64x_printInst(MCInst *MI,SStream *O,void *Info)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  MCOperand *pMVar5;
  int64_t iVar6;
  SStream *O_00;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *extraout_RDX_01;
  SStream *extraout_RDX_02;
  SStream *extraout_RDX_03;
  SStream *extraout_RDX_04;
  SStream *pSVar7;
  char *pcVar8;
  ulong uVar9;
  
  uVar2 = MCInst_getOpcode(MI);
  if ((int)uVar2 < 0x102) {
    uVar4 = uVar2 - 0xa2;
    if (uVar4 < 0x13) {
      if ((0xa8U >> (uVar4 & 0x1f) & 1) == 0) {
        if ((0x60000U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0026e4f1;
        if (uVar4 != 0) goto LAB_0026e0ab;
        goto LAB_0026e5a4;
      }
LAB_0026e1cb:
      uVar4 = MCInst_getNumOperands(MI);
      if (uVar4 != 3) {
LAB_0026e23e:
        if (0x101 < (int)uVar2) goto LAB_0026e24b;
        if (uVar2 - 0xa0 < 2) goto LAB_0026e31d;
LAB_0026e44f:
        if (1 < uVar2 - 0xb3) goto LAB_0026e597;
LAB_0026e4f1:
        uVar4 = MCInst_getNumOperands(MI);
        if (uVar4 == 3) {
          pMVar5 = MCInst_getOperand(MI,0);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,1);
            _Var1 = MCOperand_isReg(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,2);
              _Var1 = MCOperand_isReg(pMVar5);
              if (_Var1) {
                pMVar5 = MCInst_getOperand(MI,1);
                uVar4 = MCOperand_getReg(pMVar5);
                pMVar5 = MCInst_getOperand(MI,2);
                uVar3 = MCOperand_getReg(pMVar5);
                if (uVar4 == uVar3) {
                  MCInst_setOpcodePub(MI,0x8f);
                  MI->size = MI->size + 0xff;
                  pcVar8 = "SWAP2\t";
                  goto LAB_0026e994;
                }
              }
            }
          }
        }
        goto LAB_0026e597;
      }
      pMVar5 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0026e23e;
      pMVar5 = MCInst_getOperand(MI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0026e23e;
      pMVar5 = MCInst_getOperand(MI,2);
      _Var1 = MCOperand_isImm(pMVar5);
      if (!_Var1) goto LAB_0026e23e;
      pMVar5 = MCInst_getOperand(MI,2);
      iVar6 = MCOperand_getImm(pMVar5);
      if (iVar6 != 0) goto LAB_0026e23e;
      MCInst_setOpcodePub(MI,0x8c);
      MI->size = MI->size + 0xff;
      pcVar8 = "MV\t";
LAB_0026e994:
      SStream_concat0(O,pcVar8);
      uVar2 = 1;
      goto LAB_0026e9a4;
    }
LAB_0026e0ab:
    if (uVar2 < 0x33) {
      uVar9 = (ulong)uVar2;
      if ((0x4680000000000U >> (uVar9 & 0x3f) & 1) == 0) {
        if (uVar9 == 0x29) goto LAB_0026e1cb;
        goto LAB_0026e194;
      }
      uVar3 = MCInst_getNumOperands(MI);
      if (uVar3 != 3) {
LAB_0026e13f:
        if (0x101 < (int)uVar2) goto LAB_0026e24b;
        if (uVar4 < 0x13) {
          if ((0xa8U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0026e1cb;
          if ((0x60000U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0026e4f1;
          if (uVar4 == 0) goto LAB_0026e5a4;
        }
        if ((uVar2 < 0x33) && ((0x4620000000000U >> (uVar9 & 0x3f) & 1) != 0)) goto LAB_0026e1cb;
        goto LAB_0026e194;
      }
      pMVar5 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0026e13f;
      pMVar5 = MCInst_getOperand(MI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0026e13f;
      pMVar5 = MCInst_getOperand(MI,2);
      _Var1 = MCOperand_isImm(pMVar5);
      if (!_Var1) goto LAB_0026e13f;
      pMVar5 = MCInst_getOperand(MI,2);
      iVar6 = MCOperand_getImm(pMVar5);
      if (-1 < iVar6) goto LAB_0026e13f;
      MCInst_setOpcodePub(MI,0x7c);
      pMVar5 = MCInst_getOperand(MI,2);
      iVar6 = MCOperand_getImm(pMVar5);
      MCOperand_setImm(pMVar5,-iVar6);
      SStream_concat0(O,"SUB\t");
      printOperand(MI,1,O);
      pcVar8 = ", ";
      SStream_concat0(O,", ");
      printOperand(MI,2,O);
    }
    else {
LAB_0026e194:
      if (1 < uVar2 - 0xa0) goto LAB_0026e64d;
LAB_0026e31d:
      uVar4 = MCInst_getNumOperands(MI);
      if (uVar4 != 2) {
LAB_0026e377:
        uVar4 = uVar2 - 0x102;
        if (uVar4 < 8) {
          if ((0x43U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0026e46e;
          if ((0x84U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0026e3a3;
        }
        goto LAB_0026e44f;
      }
      pMVar5 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0026e377;
      pMVar5 = MCInst_getOperand(MI,1);
      _Var1 = MCOperand_isImm(pMVar5);
      if (!_Var1) goto LAB_0026e377;
      pMVar5 = MCInst_getOperand(MI,1);
      iVar6 = MCOperand_getImm(pMVar5);
      if (iVar6 != 0) goto LAB_0026e377;
      MCInst_setOpcodePub(MI,0x90);
      MI->size = MI->size + 0xff;
LAB_0026e93f:
      pcVar8 = "ZERO\t";
    }
LAB_0026e9b6:
    SStream_concat0(O,pcVar8);
switchD_0026e7f5_caseD_1:
    uVar2 = 0;
  }
  else {
LAB_0026e24b:
    uVar4 = uVar2 - 0x102;
    if (uVar4 < 0x13) {
      if ((0x43U >> (uVar4 & 0x1f) & 1) == 0) {
        if ((0x54000U >> (uVar4 & 0x1f) & 1) != 0) {
          uVar4 = MCInst_getNumOperands(MI);
          if (uVar4 == 3) {
            pMVar5 = MCInst_getOperand(MI,0);
            _Var1 = MCOperand_isReg(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,1);
              _Var1 = MCOperand_isReg(pMVar5);
              if (_Var1) {
                pMVar5 = MCInst_getOperand(MI,2);
                _Var1 = MCOperand_isImm(pMVar5);
                if (_Var1) {
                  pMVar5 = MCInst_getOperand(MI,2);
                  iVar6 = MCOperand_getImm(pMVar5);
                  if (iVar6 == -1) {
                    MCInst_setOpcodePub(MI,0x8e);
                    MI->size = MI->size + 0xff;
                    pcVar8 = "NOT\t";
                    goto LAB_0026e994;
                  }
                }
              }
            }
          }
          if ((uVar2 & 0xfffffffe) == 0xa0) goto LAB_0026e31d;
          goto LAB_0026e377;
        }
        if ((0x84U >> (uVar4 & 0x1f) & 1) == 0) goto LAB_0026e64d;
LAB_0026e3a3:
        uVar4 = MCInst_getNumOperands(MI);
        if (uVar4 == 3) {
          pMVar5 = MCInst_getOperand(MI,0);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,1);
            _Var1 = MCOperand_isReg(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,2);
              _Var1 = MCOperand_isReg(pMVar5);
              if (_Var1) {
                pMVar5 = MCInst_getOperand(MI,1);
                uVar4 = MCOperand_getReg(pMVar5);
                pMVar5 = MCInst_getOperand(MI,2);
                uVar3 = MCOperand_getReg(pMVar5);
                if (uVar4 == uVar3) {
                  MCInst_setOpcodePub(MI,0x90);
                  MI->size = MI->size + 0xfe;
                  goto LAB_0026e93f;
                }
              }
            }
          }
        }
        if ((6 < uVar2 - 0x102) || ((0x43U >> (uVar2 - 0x102 & 0x1f) & 1) == 0)) goto LAB_0026e44f;
      }
LAB_0026e46e:
      uVar4 = MCInst_getNumOperands(MI);
      if (uVar4 == 3) {
        pMVar5 = MCInst_getOperand(MI,0);
        _Var1 = MCOperand_isReg(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(MI,1);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,2);
            _Var1 = MCOperand_isImm(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,2);
              iVar6 = MCOperand_getImm(pMVar5);
              if (iVar6 == 0) {
                MCInst_setOpcodePub(MI,0x8d);
                MI->size = MI->size + 0xff;
                pcVar8 = "NEG\t";
                goto LAB_0026e994;
              }
            }
          }
        }
      }
      if (uVar2 - 0xb3 < 2) goto LAB_0026e4f1;
LAB_0026e597:
      if (uVar2 == 0xa2) {
LAB_0026e5a4:
        uVar2 = MCInst_getNumOperands(MI);
        if (uVar2 == 1) {
          pMVar5 = MCInst_getOperand(MI,0);
          _Var1 = MCOperand_isImm(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,0);
            uVar2 = MCOperand_getReg(pMVar5);
            if (uVar2 == 0x10) {
              MCInst_setOpcodePub(MI,0x8b);
              MI->size = MI->size + 0xff;
              pcVar8 = "IDLE";
              goto LAB_0026e63d;
            }
          }
        }
        uVar2 = MCInst_getNumOperands(MI);
        if (uVar2 == 1) {
          pMVar5 = MCInst_getOperand(MI,0);
          _Var1 = MCOperand_isImm(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,0);
            uVar2 = MCOperand_getReg(pMVar5);
            if (uVar2 == 1) {
              MI->size = MI->size + 0xff;
              pcVar8 = "NOP";
LAB_0026e63d:
              SStream_concat0(O,pcVar8);
              return;
            }
          }
        }
      }
    }
LAB_0026e64d:
    uVar2 = MCInst_getOpcode(MI);
    uVar2 = *(uint *)(printInstruction_OpInfo + (ulong)uVar2 * 4);
    SStream_concat0(O,(char *)((ulong)(uVar2 & 0x3ff) + 0x6ecb0f));
    uVar4 = (uint)O;
    switch(uVar2 >> 10 & 7) {
    case 0:
      goto switchD_0026e697_caseD_0;
    case 1:
      printOperand(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar2 >> 0xd & 7) {
      default:
        goto switchD_0026e7d0_caseD_0;
      case 1:
        goto switchD_0026e7d0_caseD_1;
      case 2:
switchD_0026e7d0_caseD_2:
        printOperand(MI,1,O);
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_01;
        switch(uVar2 >> 0x10 & 7) {
        case 0:
          goto switchD_0026e697_caseD_0;
        case 1:
          goto switchD_0026e7f5_caseD_1;
        case 3:
          goto switchD_0026e7d0_caseD_1;
        case 4:
          goto switchD_0026e7f5_caseD_4;
        case 5:
          goto switchD_0026e7f5_caseD_5;
        case 6:
          goto switchD_0026e7f5_caseD_6;
        case 7:
          goto switchD_0026e7f5_caseD_7;
        }
        goto switchD_0026e7f5_caseD_2;
      case 3:
switchD_0026e7d0_caseD_3:
        printOperand(MI,2,O);
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_03;
        switch(uVar2 >> 0x10 & 7) {
        case 0:
          goto switchD_0026e697_caseD_0;
        case 2:
          goto switchD_0026e7f5_caseD_2;
        case 3:
          goto switchD_0026e7d0_caseD_1;
        case 4:
          goto switchD_0026e7f5_caseD_4;
        case 5:
          goto switchD_0026e7f5_caseD_5;
        case 6:
          goto switchD_0026e7f5_caseD_6;
        case 7:
          goto switchD_0026e7f5_caseD_7;
        }
        break;
      case 4:
switchD_0026e7d0_caseD_4:
        printRegPair(MI,1,O);
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_04;
        switch(uVar2 >> 0x10 & 7) {
        case 0:
          goto switchD_0026e697_caseD_0;
        case 2:
          goto switchD_0026e7f5_caseD_2;
        case 3:
          goto switchD_0026e7d0_caseD_1;
        case 4:
          goto switchD_0026e7f5_caseD_4;
        case 5:
          goto switchD_0026e7f5_caseD_5;
        case 6:
          goto switchD_0026e7f5_caseD_6;
        case 7:
          goto switchD_0026e7f5_caseD_7;
        }
        break;
      case 5:
switchD_0026e7d0_caseD_5:
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_02;
        switch(uVar2 >> 0x10 & 7) {
        case 0:
          goto switchD_0026e697_caseD_0;
        case 2:
          goto switchD_0026e7f5_caseD_2;
        case 3:
          goto switchD_0026e7d0_caseD_1;
        case 4:
          goto switchD_0026e7f5_caseD_4;
        case 5:
          goto switchD_0026e7f5_caseD_5;
        case 6:
          goto switchD_0026e7f5_caseD_6;
        case 7:
          goto switchD_0026e7f5_caseD_7;
        }
        break;
      case 6:
        goto switchD_0026e697_caseD_0;
      }
      goto switchD_0026e7f5_caseD_1;
    case 2:
      printRegPair(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar2 >> 0xd & 7) {
      case 1:
        goto switchD_0026e7d0_caseD_1;
      case 2:
        goto switchD_0026e7d0_caseD_2;
      case 3:
        goto switchD_0026e7d0_caseD_3;
      case 4:
        goto switchD_0026e7d0_caseD_4;
      case 5:
        goto switchD_0026e7d0_caseD_5;
      case 6:
        goto switchD_0026e697_caseD_0;
      }
      break;
    case 3:
      printOperand(MI,2,O);
      SStream_concat0(O,", ");
      switch(uVar2 >> 0xd & 7) {
      case 1:
        goto switchD_0026e7d0_caseD_1;
      case 2:
        goto switchD_0026e7d0_caseD_2;
      case 3:
        goto switchD_0026e7d0_caseD_3;
      case 4:
        goto switchD_0026e7d0_caseD_4;
      case 5:
        goto switchD_0026e7d0_caseD_5;
      case 6:
        goto switchD_0026e697_caseD_0;
      }
      break;
    case 4:
      printOperand(MI,0,O);
      switch(uVar2 >> 0xd & 7) {
      case 1:
        goto switchD_0026e7d0_caseD_1;
      case 2:
        goto switchD_0026e7d0_caseD_2;
      case 3:
        goto switchD_0026e7d0_caseD_3;
      case 4:
        goto switchD_0026e7d0_caseD_4;
      case 5:
        goto switchD_0026e7d0_caseD_5;
      case 6:
        goto switchD_0026e697_caseD_0;
      }
      break;
    case 5:
      printMemOperand(MI,uVar4,O_00);
      SStream_concat0(O,", ");
      switch(uVar2 >> 0xd & 7) {
      case 1:
        goto switchD_0026e7d0_caseD_1;
      case 2:
        goto switchD_0026e7d0_caseD_2;
      case 3:
        goto switchD_0026e7d0_caseD_3;
      case 4:
        goto switchD_0026e7d0_caseD_4;
      case 5:
        goto switchD_0026e7d0_caseD_5;
      case 6:
        goto switchD_0026e697_caseD_0;
      }
      break;
    case 6:
      printMemOperand2(MI,uVar4,O_00);
      goto LAB_0026e9ac;
    case 7:
      printRegPair(MI,0,O);
      SStream_concat0(O,", ");
      pSVar7 = extraout_RDX;
      goto switchD_0026e7f5_caseD_6;
    }
switchD_0026e7d0_caseD_0:
    printOperand(MI,0,O);
    pSVar7 = extraout_RDX_00;
    switch(uVar2 >> 0x10 & 7) {
    case 0:
switchD_0026e697_caseD_0:
      return;
    case 1:
      goto switchD_0026e7f5_caseD_1;
    case 2:
switchD_0026e7f5_caseD_2:
      SStream_concat0(O,", ");
      uVar2 = 2;
      break;
    case 3:
switchD_0026e7d0_caseD_1:
      printRegPair(MI,0,O);
      return;
    case 4:
switchD_0026e7f5_caseD_4:
      uVar2 = 1;
      break;
    case 5:
switchD_0026e7f5_caseD_5:
      uVar2 = 3;
LAB_0026e9a4:
      printOperand(MI,uVar2,O);
LAB_0026e9ac:
      pcVar8 = ", ";
      goto LAB_0026e9b6;
    case 6:
switchD_0026e7f5_caseD_6:
      printMemOperand(MI,uVar4,pSVar7);
      return;
    case 7:
switchD_0026e7f5_caseD_7:
      printMemOperand2(MI,uVar4,pSVar7);
      return;
    }
  }
  printOperand(MI,uVar2,O);
  return;
}

Assistant:

void TMS320C64x_printInst(MCInst *MI, SStream *O, void *Info)
{
	if (!printAliasInstruction(MI, O, Info))
		printInstruction(MI, O, Info);
}